

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_bool>
* __thiscall
pstore::json::details::
token_matcher<(anonymous_namespace)::yaml_output,_pstore::json::details::false_complete>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>,_bool>
           *__return_storage_ptr__,
          token_matcher<(anonymous_namespace)::yaml_output,_pstore::json::details::false_complete>
          *this,parser<(anonymous_namespace)::yaml_output> *parser,maybe<char,_void> *ch)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  error_code eVar5;
  
  iVar1 = (this->super_matcher<(anonymous_namespace)::yaml_output>).state_;
  bVar4 = true;
  if (iVar1 == 2) {
    if (ch->valid_ == true) {
      pcVar3 = maybe<char,_void>::operator->(ch);
      pcVar2 = this->text_;
      if (*pcVar3 == *pcVar2) {
        this->text_ = pcVar2 + 1;
        if (pcVar2[1] == '\0') {
          (this->super_matcher<(anonymous_namespace)::yaml_output>).state_ = 3;
        }
        goto LAB_001090fe;
      }
    }
    get_error_category();
    matcher<(anonymous_namespace)::yaml_output>::set_error
              (&this->super_matcher<(anonymous_namespace)::yaml_output>,parser,(error_code *)0xb);
  }
  else if (iVar1 == 3) {
    bVar4 = true;
    if (ch->valid_ == true) {
      pcVar2 = maybe<char,_void>::operator->(ch);
      iVar1 = isalnum((int)*pcVar2);
      if (iVar1 != 0) {
        get_error_category();
        matcher<(anonymous_namespace)::yaml_output>::set_error
                  (&this->super_matcher<(anonymous_namespace)::yaml_output>,parser,(error_code *)0xb
                  );
        bVar4 = true;
        goto LAB_001090fe;
      }
      bVar4 = false;
    }
    eVar5 = anon_unknown.dwarf_112f4::yaml_output::boolean_value(&parser->callbacks_,false);
    matcher<(anonymous_namespace)::yaml_output>::set_error
              (&this->super_matcher<(anonymous_namespace)::yaml_output>,parser,
               (error_code *)(ulong)(uint)eVar5._M_value);
    (this->super_matcher<(anonymous_namespace)::yaml_output>).state_ = 1;
  }
  else if (iVar1 == 1) {
    assert_failed("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x1ad);
  }
LAB_001090fe:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_pstore::json::details::deleter<pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<(anonymous_namespace)::yaml_output>_*,_false>
  ._M_head_impl = (matcher<(anonymous_namespace)::yaml_output> *)0x0;
  __return_storage_ptr__->second = bVar4;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            token_matcher<Callbacks, DoneFunction>::consume (parser<Callbacks> & parser,
                                                             maybe<char> ch) {
                bool match = true;
                switch (this->get_state ()) {
                case start_state:
                    if (!ch || *ch != *text_) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        ++text_;
                        if (*text_ == '\0') {
                            // We've run out of input text, so ensure that the next character isn't
                            // alpha-numeric.
                            this->set_state (last_state);
                        }
                    }
                    break;
                case last_state:
                    if (ch) {
                        if (std::isalnum (*ch) != 0) {
                            this->set_error (parser, error_code::unrecognized_token);
                            return {nullptr, true};
                        }
                        match = false;
                    }
                    this->set_error (parser, done_ (parser));
                    this->set_state (done_state);
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, match};
            }